

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cpp
# Opt level: O2

string * __thiscall Download::GetFileName(string *__return_storage_ptr__,Download *this,string *url)

{
  long lVar1;
  string pathSeparator;
  allocator local_30 [32];
  
  std::__cxx11::string::string((string *)&pathSeparator,"/",local_30);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_30);
  if (url->_M_string_length != 0) {
    lVar1 = std::__cxx11::string::rfind((string *)url,(ulong)&pathSeparator);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_30,(ulong)url);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_30);
      std::__cxx11::string::~string((string *)local_30);
    }
  }
  std::__cxx11::string::~string((string *)&pathSeparator);
  return __return_storage_ptr__;
}

Assistant:

std::string Download::GetFileName(const std::string &url)
{
#ifdef __WIN32
	std::string pathSeparator = "\\";
#else 
	std::string pathSeparator = "/";
#endif
	std::string fileName="";
	if(!url.empty())
	{
		size_t index = url.rfind(pathSeparator);
		if(index != std::string::npos)
		{
			fileName = url.substr(index+pathSeparator.size());
		}
	}
	return fileName;	
}